

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void cppcms::json::anon_unknown_9::indent(ostream *out,char c,int *tabs)

{
  int iVar1;
  ostream *poVar2;
  uint uVar3;
  char local_34 [5];
  char local_2f [6];
  char local_29;
  
  if (*tabs < 0) {
    local_34[4] = c;
    std::__ostream_insert<char,std::char_traits<char>>(out,local_34 + 4,1);
    return;
  }
  if (c < ']') {
    if (c == ',') {
      local_2f[2] = 0x2c;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,local_2f + 2,1);
      local_2f[3] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2f + 3,1);
      if (*tabs < 1) {
        return;
      }
      uVar3 = *tabs + 1;
      do {
        local_34[1] = 9;
        std::__ostream_insert<char,std::char_traits<char>>(out,local_34 + 1,1);
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
      return;
    }
    if (c == ':') {
      std::__ostream_insert<char,std::char_traits<char>>(out," :\t",3);
      return;
    }
    if (c != '[') {
      return;
    }
  }
  else {
    if ((c == ']') || (c == '}')) {
      local_2f[4] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(out,local_2f + 4,1);
      uVar3 = *tabs;
      *tabs = uVar3 - 1;
      if (1 < (int)uVar3) {
        do {
          local_34[2] = 9;
          std::__ostream_insert<char,std::char_traits<char>>(out,local_34 + 2,1);
          uVar3 = uVar3 - 1;
        } while (1 < uVar3);
      }
      local_2f[5] = c;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,local_2f + 5,1);
      local_29 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
      if (*tabs < 1) {
        return;
      }
      uVar3 = *tabs + 1;
      do {
        local_34[3] = 9;
        std::__ostream_insert<char,std::char_traits<char>>(out,local_34 + 3,1);
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
      return;
    }
    if (c != '{') {
      return;
    }
  }
  local_2f[0] = c;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,local_2f,1);
  local_2f[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2f + 1,1);
  iVar1 = *tabs;
  *tabs = iVar1 + 1;
  if (-1 < iVar1) {
    uVar3 = iVar1 + 2;
    do {
      local_34[0] = '\t';
      std::__ostream_insert<char,std::char_traits<char>>(out,local_34,1);
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

void indent(std::ostream &out,char c,int &tabs)
		{
			if(tabs < 0) {
				out<<c;
				return;
			}
			switch(c) {
			case '{':
			case '[':
				out<<c<<'\n';
				tabs++;
				pad(out,tabs);
				break;
			case ',':
				out<<c<<'\n';
				pad(out,tabs);
				break;
			case ':':
				out<<" :\t";
				break;
			case '}':
			case ']':
				out<<'\n';
				tabs--;
				pad(out,tabs);
				out<<c<<'\n';
				pad(out,tabs);
				break;
			}
		}